

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp analyze_list(sexp ctx,sexp x,int depth,int defok)

{
  sexp *ppsVar1;
  sexp psVar2;
  int iVar3;
  sexp x_00;
  anon_union_24768_35_b8e82fc1_for_value *paVar4;
  sexp local_60;
  sexp tmp;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_40.var = &tmp;
  tmp = (sexp)&DAT_0000043e;
  local_50.var = &local_60;
  local_40.next = &local_50;
  local_50.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  local_60 = (sexp)&DAT_0000023e;
  ppsVar1 = &(ctx->value).type.cpl;
  for (; (x_00 = local_60, ((ulong)x & 3) == 0 && (x->tag == 6)); x = (x->value).type.cpl) {
    sexp_push_op(ctx,&local_60,(sexp)&DAT_0000003e);
    x_00 = analyze(ctx,(x->value).type.name,depth,defok);
    paVar4 = (anon_union_24768_35_b8e82fc1_for_value *)ppsVar1;
    tmp = x_00;
    if ((((ulong)x_00 & 3) == 0) && (x_00->tag == 0x13)) break;
    do {
      psVar2 = (paVar4->type).name;
      if (((psVar2 == (sexp)0x0) || (((ulong)psVar2 & 3) != 0)) || (psVar2->tag != 0x17))
      goto LAB_0012ae58;
      paVar4 = &psVar2->value;
    } while ((psVar2->value).type.cpl == (sexp)0x0);
    iVar3 = nondefp(x_00);
    defok = defok | -(uint)(iVar3 != 0);
LAB_0012ae58:
    (local_60->value).type.slots = (x->value).type.slots;
    (local_60->value).type.name = x_00;
  }
  local_60 = x_00;
  if ((((ulong)local_60 & 3) == 0) && (local_60->tag == 6)) {
    local_60 = sexp_nreverse_op(ctx,(sexp)0x0,1,local_60);
  }
  (ctx->value).context.saves = local_50.next;
  return local_60;
}

Assistant:

static sexp analyze_list (sexp ctx, sexp x, int depth, int defok) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  for (res=SEXP_NULL; sexp_pairp(x); x=sexp_cdr(x)) {
    sexp_push(ctx, res, SEXP_FALSE);
    tmp = analyze(ctx, sexp_car(x), depth, defok);
    if (sexp_exceptionp(tmp)) {
      res = tmp;
      break;
    } else {
      if (lambda_envp(ctx) && nondefp(tmp)) defok = -1;  /* -1 to warn */
      sexp_pair_source(res) = sexp_pair_source(x);
      sexp_car(res) = tmp;
    }
  }
  if (sexp_pairp(res)) res = sexp_nreverse(ctx, res);
  sexp_gc_release2(ctx);
  return res;
}